

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

Api RtMidi::getCompiledApiByName(string *name)

{
  bool bVar1;
  uint i;
  string *name_local;
  
  bVar1 = false;
  while( true ) {
    if (bVar1) {
      return UNSPECIFIED;
    }
    bVar1 = std::operator==(name,rtmidi_api_names[2][0]);
    if (bVar1) break;
    bVar1 = true;
  }
  return LINUX_ALSA;
}

Assistant:

RtMidi::Api RtMidi :: getCompiledApiByName( const std::string &name )
{
  unsigned int i=0;
  for (i = 0; i < rtmidi_num_compiled_apis; ++i)
    if (name == rtmidi_api_names[rtmidi_compiled_apis[i]][0])
      return rtmidi_compiled_apis[i];
  return RtMidi::UNSPECIFIED;
}